

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.h
# Opt level: O1

bool __thiscall
pktalloc::LightVector<pktalloc::Allocator::WindowHeader_*>::SetSize_NoCopy
          (LightVector<pktalloc::Allocator::WindowHeader_*> *this,uint elements)

{
  LightVector<pktalloc::Allocator::WindowHeader_*> *pLVar1;
  bool bVar2;
  WindowHeader **ppWVar3;
  uint uVar4;
  
  if (this->Allocated < elements) {
    uVar4 = elements * 3 >> 1;
    ppWVar3 = (WindowHeader **)operator_new__((ulong)uVar4 * 8,(nothrow_t *)&std::nothrow);
    if (ppWVar3 != (WindowHeader **)0x0) {
      pLVar1 = (LightVector<pktalloc::Allocator::WindowHeader_*> *)this->DataPtr;
      this->Allocated = uVar4;
      this->DataPtr = ppWVar3;
      if (pLVar1 != (LightVector<pktalloc::Allocator::WindowHeader_*> *)0x0 && pLVar1 != this) {
        operator_delete__(pLVar1);
      }
      if (ppWVar3 != (WindowHeader **)0x0) goto LAB_001127b9;
    }
    bVar2 = false;
  }
  else {
LAB_001127b9:
    this->Size = elements;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool SetSize_NoCopy(unsigned elements)
    {
        PKTALLOC_DEBUG_ASSERT(Size <= Allocated);

        // If it is actually expanding, and it needs to grow:
        if (elements > Allocated)
        {
            const unsigned newAllocated = (elements * 3) / 2;
            T* newData = new(std::nothrow) T[newAllocated];
            if (!newData)
                return false;
            T* oldData = DataPtr;
            Allocated  = newAllocated;
            DataPtr    = newData;

            // Delete old data without copying
            if (oldData != &PreallocatedData[0]) {
                delete[] oldData;
            }
        }

        Size = elements;
        return true;
    }